

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

void rw::d3d::allocateDXT(Raster *raster,int32 dxt,int32 numLevels,bool32 hasAlpha)

{
  undefined8 *puVar1;
  void *pvVar2;
  uint32 usage;
  D3dRaster *ras;
  int32 local_18;
  bool32 hasAlpha_local;
  int32 numLevels_local;
  int32 dxt_local;
  Raster *raster_local;
  
  puVar1 = (undefined8 *)((long)&raster->platform + (long)nativeRasterOffset);
  *(uint32 *)(puVar1 + 3) = allocateDXT::dxtMap[dxt + -1];
  *(bool *)(puVar1 + 4) = hasAlpha != 0;
  *(undefined1 *)((long)puVar1 + 0x21) = 1;
  if ((*(byte *)((long)puVar1 + 0x22) & 1) == 0) {
    local_18 = numLevels;
    if ((raster->format & 0x8000U) == 0) {
      local_18 = 1;
    }
  }
  else {
    local_18 = 0;
  }
  usage = 0;
  if ((*(byte *)((long)puVar1 + 0x22) & 1) != 0) {
    usage = 0x400;
  }
  pvVar2 = createTexture(raster->width,raster->height,local_18,usage,*(uint32 *)(puVar1 + 3));
  *puVar1 = pvVar2;
  raster->flags = raster->flags & 0xffffff7f;
  return;
}

Assistant:

void
allocateDXT(Raster *raster, int32 dxt, int32 numLevels, bool32 hasAlpha)
{
	static uint32 dxtMap[] = {
		0x31545844,	// DXT1
		0x32545844,	// DXT2
		0x33545844,	// DXT3
		0x34545844,	// DXT4
		0x35545844,	// DXT5
	};
	D3dRaster *ras = GETD3DRASTEREXT(raster);
	ras->format = dxtMap[dxt-1];
	ras->hasAlpha = hasAlpha;
	ras->customFormat = 1;
	if(ras->autogenMipmap)
		numLevels = 0;
	else if(raster->format & Raster::MIPMAP)
		{}
	else
		numLevels = 1;
	ras->texture = createTexture(raster->width, raster->height,
	                             numLevels,
	                             ras->autogenMipmap ? D3DUSAGE_AUTOGENMIPMAP : 0,
	                             ras->format);
	raster->flags &= ~Raster::DONTALLOCATE;
}